

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alc.cpp
# Opt level: O3

ALCenum anon_unknown.dwarf_85896::EnumFromDevFmt(DevFmtType type)

{
  runtime_error *this;
  uint __val;
  undefined7 in_register_00000039;
  string sStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  __val = (uint)CONCAT71(in_register_00000039,type);
  if (type < (DevFmtFloat|DevFmtUByte)) {
    return __val | 0x1400;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::to_string(&sStack_58,__val);
  std::operator+(&local_38,"Invalid DevFmtType: ",&sStack_58);
  std::runtime_error::runtime_error(this,(string *)&local_38);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

ALCenum EnumFromDevFmt(DevFmtType type)
{
    switch(type)
    {
    case DevFmtByte: return ALC_BYTE_SOFT;
    case DevFmtUByte: return ALC_UNSIGNED_BYTE_SOFT;
    case DevFmtShort: return ALC_SHORT_SOFT;
    case DevFmtUShort: return ALC_UNSIGNED_SHORT_SOFT;
    case DevFmtInt: return ALC_INT_SOFT;
    case DevFmtUInt: return ALC_UNSIGNED_INT_SOFT;
    case DevFmtFloat: return ALC_FLOAT_SOFT;
    }
    throw std::runtime_error{"Invalid DevFmtType: "+std::to_string(int(type))};
}